

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_connection_state(connectdata *conn,_Bool *done)

{
  smb_conn_state sVar1;
  CURLcode CVar2;
  _Bool ssl_done;
  void *msg;
  _Bool local_21;
  void *local_20;
  
  local_20 = (void *)0x0;
  if ((conn->proto).smbc.state == SMB_CONNECTING) {
    if ((conn->handler->flags & 1) != 0) {
      local_21 = false;
      CVar2 = Curl_ssl_connect_nonblocking(conn,0,&local_21);
      if ((CVar2 != CURLE_OK) && (CVar2 != CURLE_AGAIN)) {
        return CVar2;
      }
      if (local_21 != true) {
        return CURLE_OK;
      }
    }
    CVar2 = smb_send_message(conn,'r',"",0xf);
    if (CVar2 != CURLE_OK) goto LAB_00447ec7;
    (conn->proto).smbc.state = SMB_NEGOTIATE;
  }
  CVar2 = smb_send_and_recv(conn,&local_20);
  if ((CVar2 == CURLE_OK) || (CVar2 == CURLE_AGAIN)) {
    if (local_20 == (void *)0x0) {
      return CURLE_OK;
    }
    sVar1 = (conn->proto).smbc.state;
    if (sVar1 == SMB_SETUP) {
      if (*(int *)((long)local_20 + 9) != 0) {
        Curl_conncontrol(conn,1);
        return CURLE_LOGIN_DENIED;
      }
      (conn->proto).smbc.uid = *(unsigned_short *)((long)local_20 + 0x20);
      (conn->proto).smbc.state = SMB_CONNECTED;
      *done = true;
    }
    else if (sVar1 == SMB_NEGOTIATE) {
      if ((*(int *)((long)local_20 + 9) != 0) || ((ulong)(conn->proto).ftpc.pp.response_time < 0x51)
         ) {
        Curl_conncontrol(conn,1);
        return CURLE_COULDNT_CONNECT;
      }
      *(undefined8 *)&(conn->proto).ftpc.pp.pending_resp = *(undefined8 *)((long)local_20 + 0x49);
      (conn->proto).sshc.nextstate = *(sshstate *)((long)local_20 + 0x34);
      CVar2 = smb_send_setup(conn);
      if (CVar2 != CURLE_OK) {
        Curl_conncontrol(conn,1);
        return CVar2;
      }
      (conn->proto).smbc.state = SMB_SETUP;
    }
    (conn->proto).ftpc.pp.response_time = 0;
    return CURLE_OK;
  }
LAB_00447ec7:
  Curl_conncontrol(conn,1);
  return CVar2;
}

Assistant:

static CURLcode smb_connection_state(struct connectdata *conn, bool *done)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_negotiate_response *nrsp;
  struct smb_header *h;
  CURLcode result;
  void *msg = NULL;

  if(smbc->state == SMB_CONNECTING) {
#ifdef USE_SSL
    if((conn->handler->flags & PROTOPT_SSL)) {
      bool ssl_done = FALSE;
      result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &ssl_done);
      if(result && result != CURLE_AGAIN)
        return result;
      if(!ssl_done)
        return CURLE_OK;
    }
#endif

    result = smb_send_negotiate(conn);
    if(result) {
      connclose(conn, "SMB: failed to send negotiate message");
      return result;
    }

    conn_state(conn, SMB_NEGOTIATE);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(conn, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(smbc->state) {
  case SMB_NEGOTIATE:
    if(h->status || smbc->got < sizeof(*nrsp) + sizeof(smbc->challenge) - 1) {
      connclose(conn, "SMB: negotiation failed");
      return CURLE_COULDNT_CONNECT;
    }
    nrsp = msg;
    memcpy(smbc->challenge, nrsp->bytes, sizeof(smbc->challenge));
    smbc->session_key = smb_swap32(nrsp->session_key);
    result = smb_send_setup(conn);
    if(result) {
      connclose(conn, "SMB: failed to send setup message");
      return result;
    }
    conn_state(conn, SMB_SETUP);
    break;

  case SMB_SETUP:
    if(h->status) {
      connclose(conn, "SMB: authentication failed");
      return CURLE_LOGIN_DENIED;
    }
    smbc->uid = smb_swap16(h->uid);
    conn_state(conn, SMB_CONNECTED);
    *done = true;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  return CURLE_OK;
}